

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,
                   vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  value_t vVar1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *pvVar2;
  json_value jVar3;
  pointer pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  string *val_01;
  reference pvVar7;
  long lVar8;
  string *this;
  complex<double> *vali;
  pointer pcVar9;
  complex<double> *element;
  double dVar10;
  string_view valname;
  initializer_list_t init;
  vector<double,_std::allocator<double>_> vectorVal;
  json jsonArray;
  json json;
  double local_60;
  data local_58;
  data local_40;
  
  this = (string *)&vectorVal;
  val_00 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
           (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
           (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (val_00 == pvVar2) {
    emptyBlock(__return_storage_ptr__,type,HELICS_COMPLEX_VECTOR);
    return __return_storage_ptr__;
  }
  lVar8 = (long)pvVar2 - (long)val_00;
  if (lVar8 == 0x10) {
    typeConvert(__return_storage_ptr__,type,(complex<double> *)val_00);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsComplexVectorString_abi_cxx11_((string *)&vectorVal,(helics *)val,val_00);
    json.m_data._0_8_ =
         vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    json.m_data.m_value.object =
         (object_t *)
         vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    goto LAB_0023f085;
  case HELICS_DOUBLE:
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)vectorNorm(val);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&vectorVal);
    break;
  case HELICS_INT:
    dVar10 = vectorNorm(val);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(long)dVar10;
    goto LAB_0023f029;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,(complex<double> *)val_00)
    ;
    break;
  case HELICS_VECTOR:
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve(&vectorVal,lVar8 >> 3);
    pcVar4 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pcVar9 = (val->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; pcVar9 != pcVar4; pcVar9 = pcVar9 + 1) {
      json.m_data._0_8_ = *(undefined8 *)pcVar9->_M_value;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vectorVal,(double *)&json)
      ;
      json.m_data._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vectorVal,(double *)&json)
      ;
    }
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,&vectorVal);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vectorVal.super__Vector_base<double,_std::allocator<double>_>);
    break;
  case HELICS_NAMED_POINT:
    helicsComplexVectorString_abi_cxx11_((string *)&json,(helics *)val,val_00);
    jVar3 = json.m_data.m_value;
    uVar6 = json.m_data._0_8_;
    dVar10 = nan("0");
    valname._M_str = (char *)uVar6;
    valname._M_len = (size_t)jVar3.object;
    NamedPoint::NamedPoint((NamedPoint *)&vectorVal,valname,dVar10);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&vectorVal);
    std::__cxx11::string::~string((string *)&vectorVal);
    this = (string *)&json;
LAB_0023f085:
    std::__cxx11::string::~string(this);
    break;
  case HELICS_BOOL:
    dVar10 = vectorNorm(val);
    pcVar5 = "+0";
    if (dVar10 != 0.0) {
      pcVar5 = "*1";
    }
    if (NAN(dVar10)) {
      pcVar5 = "*1";
    }
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(pcVar5 + 1);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&vectorVal
              );
    break;
  case HELICS_TIME:
    dVar10 = vectorNorm(val);
    vectorVal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)count_time<9,_long>::convert(dVar10);
LAB_0023f029:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&vectorVal);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_01 = typeNameStringRef_abi_cxx11_(HELICS_COMPLEX_VECTOR);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_01);
      pvVar7 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar7->m_data).m_type;
      (pvVar7->m_data).m_type = local_40.m_type;
      jVar3 = (pvVar7->m_data).m_value;
      (pvVar7->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      init._M_len = 0;
      init._M_array = (iterator)&jsonArray;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      pcVar4 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pcVar9 = (val->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pcVar9 != pcVar4;
          pcVar9 = pcVar9 + 1) {
        local_60 = *(double *)pcVar9->_M_value;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<double,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&vectorVal,&local_60);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(&jsonArray,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&vectorVal);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&vectorVal);
        local_60 = *(double *)(pcVar9->_M_value + 8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<double,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&vectorVal,&local_60);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(&jsonArray,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&vectorVal);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&vectorVal);
      }
      local_58.m_type = jsonArray.m_data.m_type;
      local_58._1_7_ = jsonArray.m_data._1_7_;
      local_58.m_value = jsonArray.m_data.m_value;
      jsonArray.m_data.m_type = null;
      jsonArray.m_data.m_value.object = (object_t *)0x0;
      pvVar7 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar7->m_data).m_type;
      (pvVar7->m_data).m_type = local_58.m_type;
      local_58.m_type = vVar1;
      jVar3 = (pvVar7->m_data).m_value;
      (pvVar7->m_data).m_value = local_58.m_value;
      local_58.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_58);
      fileops::generateJsonString((string *)&vectorVal,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vectorVal);
      std::__cxx11::string::~string((string *)&vectorVal);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&jsonArray.m_data);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,val);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const std::vector<std::complex<double>>& val)
{
    if (val.empty()) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (val.size() == 1) {
        return typeConvert(type, val[0]);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(val));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(val)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(
                static_cast<int64_t>(vectorNorm(val)));  // NOLINT
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(val[0]);
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(val) != 0.0) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(val));
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsComplexVectorString(val), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
        default:
            return ValueConverter<std::vector<std::complex<double>>>::convert(val);
        case DataType::HELICS_VECTOR: {
            std::vector<double> vectorVal;
            vectorVal.reserve(val.size() * 2);
            for (const auto& vali : val) {
                vectorVal.push_back(vali.real());
                vectorVal.push_back(vali.imag());
            }
            return ValueConverter<std::vector<double>>::convert(vectorVal);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_COMPLEX_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (const auto& element : val) {
                jsonArray.push_back(element.real());
                jsonArray.push_back(element.imag());
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}